

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O2

unsigned_long ixmlNamedNodeMap_getLength(IXML_NamedNodeMap *nnMap)

{
  unsigned_long uVar1;
  
  uVar1 = 0;
  if (nnMap != (IXML_NamedNodeMap *)0x0) {
    for (; nnMap->nodeItem != (IXML_Node_conflict *)0x0;
        nnMap = (IXML_NamedNodeMap *)&nnMap->nodeItem->nextSibling) {
      uVar1 = uVar1 + 1;
    }
  }
  return uVar1;
}

Assistant:

unsigned long ixmlNamedNodeMap_getLength(IXML_NamedNodeMap *nnMap)
{
	IXML_Node *tempNode;
	unsigned long length = 0lu;

	if (nnMap != NULL) {
		tempNode = nnMap->nodeItem;
		for (length = 0lu; tempNode != NULL; ++length) {
			tempNode = tempNode->nextSibling;
		}
	}

	return length;
}